

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseUnary(Parser *this)

{
  UnaryOperator UVar1;
  Mark *pMVar2;
  pointer this_00;
  Tokenizer *in_RSI;
  ExpressionNode *in_RDI;
  Tokenizer *in_stack_00000018;
  __single_object node;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> term;
  UnaryOperator op;
  Token token;
  Mark mark;
  Parser *in_stack_00000188;
  Token *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  _Head_base<0UL,_ExpressionNode_*,_false> token_00;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *in_stack_ffffffffffffff70;
  UnaryOperator *in_stack_ffffffffffffff78;
  int local_50;
  Mark local_18 [3];
  
  token_00._M_head_impl = in_RDI;
  pMVar2 = Tokenizer::getMark((Tokenizer *)0x16d2f6);
  local_18[0] = *pMVar2;
  Tokenizer::peek(in_RSI);
  Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
  if ((local_50 == 0xc) || (local_50 == 0x1e)) {
    Tokenizer::nextToken(in_stack_00000018);
    Token::~Token((Token *)0x16d34e);
    UVar1 = unaryOperatorFromToken((Parser *)in_RSI,(Token *)token_00._M_head_impl);
    parseTerm(in_stack_00000188);
    std::
    make_unique<UnaryNode,UnaryOperator_const&,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    this_00 = std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::operator->
                        ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)0x16d39f);
    Node::setMark((Node *)this_00,local_18);
    std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::
    unique_ptr<UnaryNode,std::default_delete<UnaryNode>,void>
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               token_00._M_head_impl,
               (unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)in_RDI);
    std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::~unique_ptr
              ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)
               CONCAT44(UVar1,in_stack_ffffffffffffff30));
    std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               CONCAT44(UVar1,in_stack_ffffffffffffff30));
  }
  else {
    parseTerm(in_stack_00000188);
  }
  Token::~Token((Token *)0x16d448);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (tuple<ExpressionNode_*,_std::default_delete<ExpressionNode>_>)token_00._M_head_impl;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseUnary()
{
  const auto mark = tokenizer_.getMark();
  const auto token = tokenizer_.peek();
  if(token.type == TokenType::Minus || token.type == TokenType::BinaryNot)
  {
    tokenizer_.nextToken();
    const auto op = unaryOperatorFromToken(token);
    auto term = parseTerm();
    auto node = std::make_unique<UnaryNode>(op, std::move(term));
    node->setMark(mark);
    return node;
  }
  else
    return parseTerm();
}